

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O2

void rtosc::ring_write(ringbuffer_t *ring,char *data,size_t len)

{
  ulong uVar1;
  char *__dest;
  size_t __n;
  
  uVar1 = ((ring->write).super___atomic_base<long>._M_i + len) % ring->size;
  if ((long)uVar1 < (ring->write).super___atomic_base<long>._M_i) {
    __n = ring->size - (ring->write).super___atomic_base<long>._M_i;
    len = len - __n;
    memcpy(ring->buffer + (ring->write).super___atomic_base<long>._M_i,data,__n);
    __dest = ring->buffer;
    data = data + __n;
  }
  else {
    __dest = ring->buffer + (ring->write).super___atomic_base<long>._M_i;
  }
  memcpy(__dest,data,len);
  LOCK();
  (ring->write).super___atomic_base<long>._M_i = uVar1;
  UNLOCK();
  return;
}

Assistant:

static void ring_write(ringbuffer_t *ring, const char *data, size_t len)
{
    assert(ring_write_size(ring) >= len);
    const off_t  next_write = (ring->write + len)%ring->size;

    //discontinuous write
    if(next_write < ring->write) {
        const size_t w1 = ring->size - ring->write;
        const size_t w2 = len - w1;
        memcpy(ring->buffer+ring->write, data,    w1);
        memcpy(ring->buffer,             data+w1, w2);
    } else { //contiguous
        memcpy(ring->buffer+ring->write, data, len);
    }
    ring->write = next_write;
}